

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O1

NodeAndBucket __thiscall
google::protobuf::internal::UntypedMapBase::FindFromTree
          (UntypedMapBase *this,map_index_t b,VariantKey key,iterator *it)

{
  ulong uVar1;
  bool bVar2;
  NodeBase *pNVar3;
  reference ppVar4;
  ulong uVar5;
  long extraout_RDX;
  undefined4 in_register_00000034;
  ulong uVar7;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
  *pbVar8;
  btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
  *this_00;
  iterator iVar9;
  NodeAndBucket NVar10;
  NodeAndBucket NVar11;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
  local_38;
  VariantKey local_28;
  long lVar6;
  
  lVar6 = CONCAT44(in_register_00000034,b);
  local_28.integral = key.integral;
  local_28.data = key.data;
  pbVar8 = &local_38;
  if ((this->table_[b] & 1) != 0) {
    this_00 = (btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
               *)(this->table_[b] - 1);
    iVar9 = absl::lts_20240722::container_internal::
            btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
            ::find<google::protobuf::internal::VariantKey>(this_00,&local_28);
    local_38.node_ = iVar9.node_;
    local_38.position_ = iVar9.position_;
    if (it != (iterator *)0x0) {
      it->position_ = local_38.position_;
      it->node_ = local_38.node_;
    }
    iVar9 = absl::lts_20240722::container_internal::
            btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
            ::end(this_00);
    bVar2 = absl::lts_20240722::container_internal::
            btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
            ::Equals(&local_38,(const_iterator)iVar9);
    if (bVar2) {
      pNVar3 = (NodeBase *)0x0;
    }
    else {
      ppVar4 = absl::lts_20240722::container_internal::
               btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
               ::operator*(&local_38);
      pNVar3 = ppVar4->second;
    }
    NVar10.bucket = b;
    NVar10.node = pNVar3;
    NVar10._12_4_ = 0;
    return NVar10;
  }
  FindFromTree();
  uVar5 = (ulong)*(uint *)((long)pbVar8 + 4);
  pNVar3 = (NodeBase *)((ulong)*(uint *)pbVar8 * lVar6 + uVar5 * 8);
  lVar6 = extraout_RDX;
  if (uVar5 != 0) {
    lVar6 = *(long *)((long)pbVar8 + 0x10);
    uVar7 = 0;
    do {
      uVar1 = *(ulong *)(lVar6 + uVar7 * 8);
      if ((uVar1 & 1) != 0) {
        pNVar3 = pNVar3 + *(long *)(uVar1 + 0x17) * 3 + 4;
      }
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  NVar11._8_8_ = lVar6;
  NVar11.node = pNVar3;
  return NVar11;
}

Assistant:

auto UntypedMapBase::FindFromTree(map_index_t b, VariantKey key,
                                  Tree::iterator* it) const -> NodeAndBucket {
  Tree* tree = TableEntryToTree(table_[b]);
  auto tree_it = tree->find(key);
  if (it != nullptr) *it = tree_it;
  if (tree_it != tree->end()) {
    return {tree_it->second, b};
  }
  return {nullptr, b};
}